

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileValue
          (NodeTranslator *this,Reader source,Reader type,Schema typeScope,Builder target,
          bool isBootstrap)

{
  Type type_00;
  undefined8 uVar1;
  uint index;
  uint uVar2;
  StringPtr name;
  ReaderFor<DynamicEnum> RVar3;
  undefined1 local_120 [72];
  StructSchema local_d8;
  ValueTranslator local_d0;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> value;
  ResolverGlue glue;
  undefined1 local_58 [40];
  word *pwStack_30;
  
  local_d0.resolver = &glue.super_Resolver;
  glue.super_Resolver._vptr_Resolver = (_func_int **)&PTR_Reader__0030a4c8;
  local_d0.orphanage.capTable = (this->orphanage).capTable;
  local_d0.errorReporter = this->errorReporter;
  local_d0.orphanage.arena = (this->orphanage).arena;
  glue.translator = this;
  glue.isBootstrap = isBootstrap;
  (*this->resolver->_vptr_Resolver[10])(local_120,this->resolver,typeScope.raw);
  uVar1 = local_120._8_8_;
  if (local_120[0] != false) {
    type_00.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)local_120._16_8_;
    type_00.baseType = local_120._8_2_;
    type_00.listDepth = local_120[10];
    type_00.isImplicitParam = (bool)local_120[0xb];
    type_00.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_120._12_2_;
    type_00._6_2_ = local_120._14_2_;
    local_d8.super_Schema.raw = (Schema)((long)schemas::s_d07378ede1f9cc60 + 0x48);
    StructSchema::getUnionFields((FieldSubset *)local_120,&local_d8);
    uVar2 = (uint)uVar1;
    index = 0xe;
    if ((uVar1 & 0xff0000) == 0) {
      index = uVar2 & 0xffff;
    }
    StructSchema::FieldSubset::operator[]((Field *)&value,(FieldSubset *)local_120,index);
    local_58._32_8_ = value.field_1.value.builder.capTable;
    pwStack_30 = value.field_1.value.builder.location;
    local_58._16_8_ = value.field_1.value.builder.tag.content;
    local_58._24_8_ = value.field_1.value.builder.segment;
    local_58._0_8_ = value.field_1._8_8_;
    local_58._8_8_ = value.field_1._16_8_;
    name.content = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName((Reader *)local_58);
    ValueTranslator::compileValue
              ((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)local_120,&local_d0,source,type_00);
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
              (&value,(NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_120);
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
              ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)local_120);
    if (value.isSet == true) {
      if ((uVar2 & 0xffffff) == 0xf) {
        Orphan<capnp::DynamicValue>::getReader((Reader *)local_120,&value.field_1.value);
        RVar3 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                          ((Reader *)local_120);
        *(undefined2 *)target._builder.data = 0xf;
        *(uint16_t *)((long)target._builder.data + 2) = RVar3.value;
        DynamicValue::Reader::~Reader((Reader *)local_120);
      }
      else {
        local_120._40_4_ = target._builder.dataSize;
        local_120._44_2_ = target._builder.pointerCount;
        local_120._46_2_ = target._builder._38_2_;
        local_120._24_8_ = target._builder.data;
        local_120._32_8_ = target._builder.pointers;
        local_120._8_8_ = target._builder.segment;
        local_120._16_8_ = target._builder.capTable;
        local_120._0_8_ = (long)schemas::s_ce23dcd2d7b00c9b + 0x48;
        DynamicStruct::Builder::adopt((Builder *)local_120,name,&value.field_1.value);
      }
    }
    kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue(&value);
  }
  return;
}

Assistant:

void NodeTranslator::compileValue(Expression::Reader source, schema::Type::Reader type,
                                  Schema typeScope, schema::Value::Builder target,
                                  bool isBootstrap) {
  class ResolverGlue: public ValueTranslator::Resolver {
  public:
    inline ResolverGlue(NodeTranslator& translator, bool isBootstrap)
        : translator(translator), isBootstrap(isBootstrap) {}

    kj::Maybe<DynamicValue::Reader> resolveConstant(Expression::Reader name) override {
      return translator.readConstant(name, isBootstrap);
    }

    kj::Maybe<kj::Array<const byte>> readEmbed(LocatedText::Reader filename) override {
      return translator.readEmbed(filename);
    }

  private:
    NodeTranslator& translator;
    bool isBootstrap;
  };

  ResolverGlue glue(*this, isBootstrap);
  ValueTranslator valueTranslator(glue, errorReporter, orphanage);

  KJ_IF_MAYBE(typeSchema, resolver.resolveBootstrapType(type, typeScope)) {
    kj::StringPtr fieldName = Schema::from<schema::Type>()
        .getUnionFields()[static_cast<uint>(typeSchema->which())].getProto().getName();

    KJ_IF_MAYBE(value, valueTranslator.compileValue(source, *typeSchema)) {
      if (typeSchema->isEnum()) {
        target.setEnum(value->getReader().as<DynamicEnum>().getRaw());
      } else {
        toDynamic(target).adopt(fieldName, kj::mv(*value));
      }
    }
  }
}